

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

bool __thiscall llvm::FoldingSetNodeID::operator<(FoldingSetNodeID *this,FoldingSetNodeID *RHS)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = (RHS->Bits).super_SmallVectorImpl<unsigned_int>.
          super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  uVar2 = (this->Bits).super_SmallVectorImpl<unsigned_int>.
          super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  if (uVar2 == uVar1) {
    iVar3 = memcmp((this->Bits).super_SmallVectorImpl<unsigned_int>.
                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                   super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
                   (RHS->Bits).super_SmallVectorImpl<unsigned_int>.
                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                   super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
                   (ulong)uVar1 << 2);
    return SUB41((uint)iVar3 >> 0x1f,0);
  }
  return uVar2 < uVar1;
}

Assistant:

size_t size() const { return Size; }